

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::torrent::get_peer_info
          (torrent *this,
          vector<libtorrent::v1_2::peer_info,_std::allocator<libtorrent::v1_2::peer_info>_> *v)

{
  int iVar1;
  pointer pppVar2;
  peer_connection *ppVar3;
  pointer pppVar4;
  __weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  ::std::vector<libtorrent::v1_2::peer_info,_std::allocator<libtorrent::v1_2::peer_info>_>::clear(v)
  ;
  pppVar2 = (this->super_torrent_hot_members).m_connections.
            super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            .
            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (pppVar4 = (this->super_torrent_hot_members).m_connections.
                 super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                 .
                 super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; pppVar4 != pppVar2;
      pppVar4 = pppVar4 + 1) {
    ppVar3 = *pppVar4;
    ::std::__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
              (&local_40,
               &(ppVar3->super_peer_connection_hot_members).m_torrent.
                super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>);
    if (local_40._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_40._M_refcount);
    }
    else {
      iVar1 = (local_40._M_refcount._M_pi)->_M_use_count;
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_40._M_refcount);
      if (iVar1 != 0) {
        ::std::vector<libtorrent::v1_2::peer_info,_std::allocator<libtorrent::v1_2::peer_info>_>::
        emplace_back<>(v);
        (*(ppVar3->super_bandwidth_socket)._vptr_bandwidth_socket[0xd])
                  (ppVar3,(v->
                          super__Vector_base<libtorrent::v1_2::peer_info,_std::allocator<libtorrent::v1_2::peer_info>_>
                          )._M_impl.super__Vector_impl_data._M_finish + -1);
      }
    }
  }
  return;
}

Assistant:

void torrent::get_peer_info(std::vector<peer_info>* v)
	{
		v->clear();
		for (auto const* peer : *this)
		{
			TORRENT_ASSERT(peer->m_in_use == 1337);

			// incoming peers that haven't finished the handshake should
			// not be included in this list
			if (peer->associated_torrent().expired()) continue;

			v->emplace_back();
			peer_info& p = v->back();

			peer->get_peer_info(p);
		}
	}